

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propertyId,ScriptContext *scriptContext,
               PropertyDescriptor *propertyDescriptor)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  Var local_48;
  Var value;
  Var setter;
  Var getter;
  PropertyDescriptor *propertyDescriptor_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *pRStack_18;
  PropertyId propertyId_local;
  RecyclableObject *obj_local;
  
  getter = propertyDescriptor;
  propertyDescriptor_local = (PropertyDescriptor *)scriptContext;
  scriptContext_local._4_4_ = propertyId;
  pRStack_18 = obj;
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x544,"(obj)","obj");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (propertyDescriptor_local == (PropertyDescriptor *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x545,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (getter == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x546,"(propertyDescriptor)","propertyDescriptor");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(pRStack_18);
  if (bVar3) {
    obj_local._4_4_ =
         Js::JavascriptProxy::GetOwnPropertyDescriptor
                   (pRStack_18,scriptContext_local._4_4_,(ScriptContext *)propertyDescriptor_local,
                    (PropertyDescriptor *)getter);
  }
  else {
    BVar4 = GetOwnAccessors(pRStack_18,scriptContext_local._4_4_,&setter,&value,
                            (ScriptContext *)propertyDescriptor_local);
    if (BVar4 == 0) {
      local_48 = (Var)0x0;
      BVar4 = GetOwnProperty(pRStack_18,scriptContext_local._4_4_,&local_48,
                             (ScriptContext *)propertyDescriptor_local,(PropertyValueInfo *)0x0);
      if (BVar4 == 0) {
        return 0;
      }
      if (local_48 != (Var)0x0) {
        PropertyDescriptor::SetValue((PropertyDescriptor *)getter,local_48);
      }
      pvVar2 = getter;
      iVar5 = (*(pRStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x30])(pRStack_18,(ulong)scriptContext_local._4_4_);
      PropertyDescriptor::SetWritable((PropertyDescriptor *)pvVar2,iVar5 != 0);
    }
    else {
      if (setter == (Var)0x0) {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)propertyDescriptor_local);
        setter = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
      }
      PropertyDescriptor::SetGetter((PropertyDescriptor *)getter,setter);
      if (value == (Var)0x0) {
        pJVar7 = ScriptContext::GetLibrary((ScriptContext *)propertyDescriptor_local);
        value = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
      }
      PropertyDescriptor::SetSetter((PropertyDescriptor *)getter,value);
    }
    pvVar2 = getter;
    iVar5 = (*(pRStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x31])(pRStack_18,(ulong)scriptContext_local._4_4_);
    PropertyDescriptor::SetConfigurable((PropertyDescriptor *)pvVar2,iVar5 != 0);
    pvVar2 = getter;
    iVar5 = (*(pRStack_18->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x32])(pRStack_18,(ulong)scriptContext_local._4_4_);
    PropertyDescriptor::SetEnumerable((PropertyDescriptor *)pvVar2,iVar5 != 0);
    obj_local._4_4_ = 1;
  }
  return obj_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propertyId, ScriptContext* scriptContext, PropertyDescriptor* propertyDescriptor)
    {
        Assert(obj);
        Assert(scriptContext);
        Assert(propertyDescriptor);

        if (VarIs<JavascriptProxy>(obj))
        {
            return JavascriptProxy::GetOwnPropertyDescriptor(obj, propertyId, scriptContext, propertyDescriptor);
        }
        Var getter, setter;
        if (false == JavascriptOperators::GetOwnAccessors(obj, propertyId, &getter, &setter, scriptContext))
        {
            Var value = nullptr;
            if (false == JavascriptOperators::GetOwnProperty(obj, propertyId, &value, scriptContext, nullptr))
            {
                return FALSE;
            }
            if (nullptr != value)
            {
                propertyDescriptor->SetValue(value);
            }

            //CONSIDER : Its expensive to query for each flag from type system. Combine this with the GetOwnProperty to get all the flags
            //at once. This will require a new API from type system and override in all the types which overrides IsEnumerable etc.
            //Currently there is no performance tuning for ES5. This should be ok.
            propertyDescriptor->SetWritable(FALSE != obj->IsWritable(propertyId));
        }
        else
        {
            if (nullptr == getter)
            {
                getter = scriptContext->GetLibrary()->GetUndefined();
            }
            propertyDescriptor->SetGetter(getter);

            if (nullptr == setter)
            {
                setter = scriptContext->GetLibrary()->GetUndefined();
            }
            propertyDescriptor->SetSetter(setter);
        }

        propertyDescriptor->SetConfigurable(FALSE != obj->IsConfigurable(propertyId));
        propertyDescriptor->SetEnumerable(FALSE != obj->IsEnumerable(propertyId));
        return TRUE;
    }